

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Move.h
# Opt level: O1

string * __thiscall libchess::Move::to_str_abi_cxx11_(string *__return_storage_ptr__,Move *this)

{
  ushort uVar1;
  long lVar2;
  long *plVar3;
  size_type *psVar4;
  short *local_68;
  undefined8 local_60;
  short local_58;
  undefined1 uStack_56;
  undefined5 uStack_55;
  short *local_48;
  undefined8 local_40;
  short local_38;
  undefined1 uStack_36;
  undefined5 uStack_35;
  
  uVar1 = (ushort)this->value_;
  local_58 = ((uVar1 & 0x38) << 5 | uVar1 & 7) + 0x3161;
  local_60 = 2;
  uStack_56 = 0;
  local_38 = (uVar1 >> 1 & 0x700 | uVar1 >> 6 & 7) + 0x3161;
  local_40 = 2;
  uStack_36 = 0;
  local_68 = &local_58;
  local_48 = &local_38;
  plVar3 = (long *)std::__cxx11::string::_M_append((char *)&local_68,(ulong)&local_38);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar4 = (size_type *)(plVar3 + 2);
  if ((size_type *)*plVar3 == psVar4) {
    lVar2 = plVar3[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar4;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar2;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar3;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar4;
  }
  __return_storage_ptr__->_M_string_length = plVar3[1];
  *plVar3 = (long)psVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  if (local_48 != &local_38) {
    operator_delete(local_48,CONCAT53(uStack_35,CONCAT12(uStack_36,local_38)) + 1);
  }
  if (local_68 != &local_58) {
    operator_delete(local_68,CONCAT53(uStack_55,CONCAT12(uStack_56,local_58)) + 1);
  }
  switch((uint)this->value_ >> 0xc & 7) {
  case 0:
  case 5:
    goto switchD_0010e539_caseD_0;
  case 1:
    break;
  case 2:
    break;
  case 3:
    break;
  case 4:
  }
  std::__cxx11::string::push_back((char)__return_storage_ptr__);
switchD_0010e539_caseD_0:
  return __return_storage_ptr__;
}

Assistant:

std::string to_str() const {
        std::string move_str = from_square().to_str() + to_square().to_str();
        auto promotion_pt = promotion_piece_type();
        if (promotion_pt) {
            move_str += promotion_pt->to_char();
        }
        return move_str;
    }